

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986PathAbsolute(xmlURIPtr uri,char **str)

{
  int iVar1;
  xmlChar *pxVar2;
  char *pcVar3;
  char *pcStack_28;
  int ret;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  if (**str == '/') {
    pcStack_28 = *str + 1;
    cur = (char *)str;
    str_local = &uri->scheme;
    iVar1 = xmlParse3986Segment(&stack0xffffffffffffffd8,'\0',0);
    if (iVar1 == 0) {
      do {
        if (*pcStack_28 != '/') goto LAB_001cc977;
        pcStack_28 = pcStack_28 + 1;
        uri_local._4_4_ = xmlParse3986Segment(&stack0xffffffffffffffd8,'\0',1);
      } while (uri_local._4_4_ == 0);
    }
    else {
LAB_001cc977:
      if (str_local != (char **)0x0) {
        if (str_local[6] != (char *)0x0) {
          (*xmlFree)(str_local[6]);
        }
        if (pcStack_28 == *(char **)cur) {
          str_local[6] = (char *)0x0;
        }
        else if (((ulong)str_local[9] & 2) == 0) {
          pcVar3 = xmlURIUnescapeString
                             (*(char **)cur,(int)pcStack_28 - (int)*(undefined8 *)cur,(char *)0x0);
          str_local[6] = pcVar3;
        }
        else {
          pxVar2 = xmlStrndup(*(xmlChar **)cur,(int)pcStack_28 - (int)*(undefined8 *)cur);
          str_local[6] = (char *)pxVar2;
        }
      }
      *(char **)cur = pcStack_28;
      uri_local._4_4_ = 0;
    }
  }
  else {
    uri_local._4_4_ = 1;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986PathAbsolute(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    if (*cur != '/')
        return(1);
    cur++;
    ret = xmlParse3986Segment(&cur, 0, 0);
    if (ret == 0) {
	while (*cur == '/') {
	    cur++;
	    ret = xmlParse3986Segment(&cur, 0, 1);
	    if (ret != 0) return(ret);
	}
    }
    if (uri != NULL) {
	if (uri->path != NULL) xmlFree(uri->path);
        if (cur != *str) {
            if (uri->cleanup & 2)
                uri->path = STRNDUP(*str, cur - *str);
            else
                uri->path = xmlURIUnescapeString(*str, cur - *str, NULL);
        } else {
            uri->path = NULL;
        }
    }
    *str = cur;
    return (0);
}